

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::AssignStatement::AssignStatement
          (AssignStatement *this,GeneratorState *state,Variable *variable,
          ConstValueRangeAccess valueRange)

{
  Expression *pEVar1;
  ValueRange local_d0;
  undefined1 local_40 [8];
  ExpressionGenerator generator;
  Variable *variable_local;
  GeneratorState *state_local;
  AssignStatement *this_local;
  
  generator.m_expressionStack.
  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)variable;
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__AssignStatement_032d9d80;
  this->m_variable =
       (Variable *)
       generator.m_expressionStack.
       super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  this->m_valueExpr = (Expression *)0x0;
  ExpressionGenerator::ExpressionGenerator((ExpressionGenerator *)local_40,state);
  ValueRange::ValueRange(&local_d0,valueRange);
  pEVar1 = ExpressionGenerator::generate((ExpressionGenerator *)local_40,&local_d0,1);
  this->m_valueExpr = pEVar1;
  ValueRange::~ValueRange(&local_d0);
  ExpressionGenerator::~ExpressionGenerator((ExpressionGenerator *)local_40);
  return;
}

Assistant:

AssignStatement::AssignStatement (GeneratorState& state, const Variable* variable, ConstValueRangeAccess valueRange)
	: m_variable	(variable)
	, m_valueExpr	(DE_NULL)
{
	// Generate random value
	ExpressionGenerator generator(state);
	m_valueExpr = generator.generate(valueRange, 1);
}